

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntMathCommon.h
# Opt level: O3

bool IntConstMath::Sub(IntConstType left,IntConstType right,IRType type,IntConstType *result)

{
  bool bVar1;
  
  *result = left - right;
  bVar1 = true;
  if (!SBORROW8(left,right)) {
    bVar1 = IsValid(left - right,type);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool IntMathCommon<T>::Sub(T left, T right, T *pResult)
{
#if __has_builtin(__builtin_sub_overflow)
    return __builtin_sub_overflow(left, right, pResult);
#else
    // Overflow occurs when the result has a different sign from the left
    // operand, and the result has the same sign as the right operand
    *pResult = static_cast<T>(
        static_cast<UnsignedType>(left) - static_cast<UnsignedType>(right));
    return ((left ^ *pResult) & ~(right ^ *pResult)) < 0;
#endif
}